

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_std::pair<const_void_*,_const_void_*>_&,_const_std::pair<const_void_*,_const_void_*>_&>
* __thiscall
Catch::ExprLhs<std::pair<void_const*,void_const*>const&>::operator!=
          (BinaryExpr<const_std::pair<const_void_*,_const_void_*>_&,_const_std::pair<const_void_*,_const_void_*>_&>
           *__return_storage_ptr__,ExprLhs<std::pair<void_const*,void_const*>const&> *this,
          pair<const_void_*,_const_void_*> *rhs)

{
  pair<const_void_*,_const_void_*> *lhs;
  bool comparisonResult;
  StringRef local_30;
  pair<const_void_*,_const_void_*> *local_20;
  pair<const_void_*,_const_void_*> *rhs_local;
  ExprLhs<const_std::pair<const_void_*,_const_void_*>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (pair<const_void_*,_const_void_*> *)this;
  this_local = (ExprLhs<const_std::pair<const_void_*,_const_void_*>_&> *)__return_storage_ptr__;
  comparisonResult =
       compareNotEqual<std::pair<void_const*,void_const*>,std::pair<void_const*,void_const*>const&>
                 (*(pair<const_void_*,_const_void_*> **)this,rhs);
  lhs = *(pair<const_void_*,_const_void_*> **)this;
  StringRef::StringRef(&local_30,"!=");
  BinaryExpr<const_std::pair<const_void_*,_const_void_*>_&,_const_std::pair<const_void_*,_const_void_*>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }